

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O1

bool __thiscall optimization::common_expr_del::Node::operator<(Node *this,Node *other)

{
  Op *__v;
  Op *__v_00;
  byte bVar1;
  byte bVar2;
  __index_type _Var3;
  variant_alternative_t<0UL,_variant<Op,_ExtraNormOp,_InNormOp>_> vVar4;
  variant_alternative_t<1UL,_variant<Op,_ExtraNormOp,_InNormOp>_> vVar5;
  pointer pvVar6;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pvVar7;
  bool bVar8;
  variant_alternative_t<0UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar9;
  variant_alternative_t<2UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar10;
  variant_alternative_t<1UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar11;
  variant_alternative_t<2UL,_variant<Op,_ExtraNormOp,_InNormOp>_> vVar12;
  pointer pvVar13;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reverse_operands;
  char local_49;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  if (this->is_leaf != other->is_leaf) {
    return this->is_leaf < other->is_leaf;
  }
  bVar1 = *(__index_type *)
           ((long)&(this->op).
                   super__Variant_base<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
           + 4);
  bVar2 = *(__index_type *)
           ((long)&(other->op).
                   super__Variant_base<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
           + 4);
  if (bVar1 != bVar2) {
    return bVar1 < bVar2;
  }
  __v = &this->op;
  __v_00 = &other->op;
  if (bVar1 == 1) {
    pvVar11 = std::
              get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                        (__v);
    vVar5 = *pvVar11;
    pvVar11 = std::
              get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                        (__v_00);
    if (vVar5 != *pvVar11) {
      pvVar10 = std::
                get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                          (__v);
      vVar12 = *pvVar10;
      pvVar10 = std::
                get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                          (__v_00);
      goto LAB_0012d47f;
    }
  }
  else if (bVar1 == 0) {
    pvVar9 = std::
             get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v);
    vVar4 = *pvVar9;
    pvVar9 = std::
             get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v_00);
    if (vVar4 != *pvVar9) {
      pvVar10 = std::
                get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                          (__v);
      vVar12 = *pvVar10;
      pvVar10 = std::
                get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                          (__v_00);
LAB_0012d47f:
      return (int)vVar12 < (int)*pvVar10;
    }
  }
  else {
    pvVar10 = std::
              get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                        (__v);
    vVar12 = *pvVar10;
    pvVar10 = std::
              get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                        (__v_00);
    if (vVar12 != *pvVar10) {
      pvVar10 = std::
                get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                          (__v);
      vVar12 = *pvVar10;
      pvVar10 = std::
                get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                          (__v_00);
      goto LAB_0012d47f;
    }
  }
  _Var3 = *(__index_type *)
           ((long)&(this->op).
                   super__Variant_base<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                   .
                   super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
           + 4);
  if (_Var3 == '\0') {
    pvVar9 = std::
             get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                       (__v);
    if ((*pvVar9 == Add) ||
       (pvVar9 = std::
                 get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                           (__v), *pvVar9 == Mul)) {
      pvVar13 = (this->operands).
                super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (this->operands).
               super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar7 = (other->operands).
               super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pvVar6 - (long)pvVar13 ==
          (long)(other->operands).
                super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) {
        bVar8 = pvVar13 == pvVar6;
        if (bVar8) {
LAB_0012d489:
          if (bVar8) {
            return false;
          }
        }
        else {
          local_49 = '\x01';
          local_48.
          super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_49;
          local_48.
          super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pvVar13;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr
            [*(__index_type *)
              ((long)&(pvVar7->
                      super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).
                      super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                      .
                      super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                      .
                      super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                      .
                      super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              + 0x20)]._M_data)((anon_class_16_2_9763bfdf *)&local_48,pvVar7);
          while (local_49 == '\x01') {
            pvVar13 = pvVar13 + 1;
            bVar8 = pvVar13 == pvVar6;
            if (bVar8) goto LAB_0012d489;
            local_49 = '\x01';
            local_48.
            super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_49;
            local_48.
            super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar13;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr
              [*(__index_type *)
                ((long)&pvVar7[1].
                        super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                        .
                        super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                        .
                        super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                        .
                        super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                + 0x20)]._M_data)((anon_class_16_2_9763bfdf *)&local_48,pvVar7 + 1);
            pvVar7 = pvVar7 + 1;
          }
        }
      }
      std::
      vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_48,&this->operands);
      std::
      __reverse<__gnu_cxx::__normal_iterator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>*,std::vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>>>
                (local_48.
                 super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      bVar8 = std::operator==(&local_48,&other->operands);
      std::
      vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_48);
      if (bVar8) {
        return false;
      }
    }
  }
  else if (_Var3 != '\x01') {
    __assert_fail("op.index() == 0 || op.index() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/common_expression_delete.hpp"
                  ,0x9f,"bool optimization::common_expr_del::Node::operator<(const Node &) const");
  }
  bVar8 = std::
          __lexicographical_compare_impl<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>const*,std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>const*,__gnu_cxx::__ops::_Iter_less_iter>
                    ((this->operands).
                     super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->operands).
                     super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (other->operands).
                     super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (other->operands).
                     super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  return bVar8;
}

Assistant:

bool operator<(const Node& other) const {
    if (is_leaf != other.is_leaf) {
      return is_leaf < other.is_leaf;
    }
    if (op.index() != other.op.index()) {
      return op.index() < other.op.index();
    }
    // same kind op
    if (op.index() == 0) {
      if (std::get<NormOp>(op) != std::get<NormOp>(other.op)) {
        return std::get<NormOp>(op) < std::get<NormOp>(other.op);
      }
    } else if (op.index() == 1) {
      if (std::get<ExtraNormOp>(op) != std::get<ExtraNormOp>(other.op)) {
        return std::get<ExtraNormOp>(op) < std::get<ExtraNormOp>(other.op);
      }
    } else {
      if (std::get<InNormOp>(op) != std::get<InNormOp>(other.op)) {
        return std::get<InNormOp>(op) < std::get<InNormOp>(other.op);
      }
    }
    assert(op.index() == 0 ||
           op.index() == 1);  // only Norm op is allowed to reuse the node
    // same op
    if (op.index() == 0) {
      if (std::get<NormOp>(op) == NormOp::Add ||
          std::get<NormOp>(op) == NormOp::Mul) {
        if (operands == other.operands) {
          return false;
        }
        std::vector<Operand> reverse_operands(operands);
        std::reverse(reverse_operands.begin(), reverse_operands.end());
        if (reverse_operands == other.operands) {
          return false;
        }
      }
    }

    return operands < other.operands;
  }